

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_mt_test.c
# Opt level: O2

int mt_dec_decode(MpiDecTestCmd *cmd)

{
  MppCodingType MVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  FileReader pvVar4;
  MPP_RET MVar5;
  int iVar6;
  MPP_RET MVar7;
  char *pcVar8;
  MppCodingType MVar9;
  MppCtx ctx;
  MppApi *mpi;
  MppParam local_f8;
  MppPacket packet;
  pthread_t thd_out;
  pthread_t thd_in;
  MpiDecMtLoopData data;
  pthread_attr_t attr;
  
  pvVar4 = cmd->reader;
  ctx = (MppCtx)0x0;
  mpi = (MppApi *)0x0;
  packet = (MppPacket)0x0;
  local_f8 = (MppParam)0x0;
  MVar1 = cmd->type;
  RVar2 = cmd->width;
  RVar3 = cmd->height;
  thd_out = 0;
  _mpp_log_l(4,"mpi_dec_mt_test","mpi_dec_mt_test start\n",0);
  data.reader = (FileReader)0x0;
  data.quiet = 0;
  data._108_4_ = 0;
  data.fp_output = (FILE *)0x0;
  data.frame_count = 0;
  data.frame_num = 0;
  data.packet_size = 0;
  data.frame = (MppFrame)0x0;
  data.frm_grp = (MppBufferGroup)0x0;
  data.packet = (MppPacket)0x0;
  data.buf = (char *)0x0;
  data.buf_mgr = (DecBufMgr)0x0;
  data.mpi = (MppApi *)0x0;
  data.loop_end = 0;
  data._28_4_ = 0;
  data.cmd = (MpiDecTestCmd *)0x0;
  data.ctx = (MppCtx)0x0;
  if (cmd->have_output != 0) {
    data.fp_output = (FILE *)fopen(cmd->file_output,"w+b");
    if ((FILE *)data.fp_output == (FILE *)0x0) {
      MVar5 = MPP_OK;
      _mpp_log_l(2,"mpi_dec_mt_test","failed to open output file %s\n",0,cmd->file_output);
      goto LAB_00104e62;
    }
  }
  MVar5 = dec_buf_mgr_init(&data.buf_mgr);
  if (MVar5 == MPP_OK) {
    MVar5 = mpp_packet_init(&packet,0,0);
    if (MVar5 == MPP_OK) {
      MVar9 = MVar1;
      _mpp_log_l(4,"mpi_dec_mt_test","mpi_dec_mt_test decoder test start w %d h %d type %d\n",0,
                 RVar2,RVar3,MVar1);
      MVar5 = mpp_create(&ctx,&mpi);
      if (MVar5 == MPP_OK) {
        MVar5 = mpp_init(ctx,0,MVar1);
        if (MVar5 == MPP_OK) {
          attr.__align._0_4_ = 0xffffffff;
          MVar5 = (*mpi->control)(ctx,MPP_SET_OUTPUT_TIMEOUT,&attr);
          if (MVar5 != MPP_OK) {
            _mpp_log_l(2,"mpi_dec_mt_test","Failed to set output timeout %d ret %d\n",0,
                       attr.__align._0_4_,MVar5,MVar9);
            goto LAB_00104e62;
          }
          mpp_dec_cfg_init(&local_f8);
          MVar5 = (*mpi->control)(ctx,MPP_DEC_GET_CFG,local_f8);
          if (MVar5 == MPP_OK) {
            MVar5 = mpp_dec_cfg_set_u32(local_f8,"base:split_parse",1);
            if (MVar5 == MPP_OK) {
              MVar5 = (*mpi->control)(ctx,MPP_DEC_SET_CFG,local_f8);
              if (MVar5 != MPP_OK) {
                _mpp_log_l(2,"mpi_dec_mt_test","%p failed to set cfg %p ret %d\n",0,ctx,local_f8,
                           MVar5);
                goto LAB_00104e62;
              }
              data.ctx = ctx;
              data.mpi = mpi;
              data._24_8_ = data._24_8_ & 0xffffffff00000000;
              data.packet = packet;
              data.frame = (MppFrame)0x0;
              data._88_8_ = (ulong)(uint)cmd->frame_num << 0x20;
              data.quiet = cmd->quiet;
              data.cmd = cmd;
              data.reader = pvVar4;
              pthread_attr_init((pthread_attr_t *)&attr);
              pthread_attr_setdetachstate((pthread_attr_t *)&attr,0);
              iVar6 = pthread_create(&thd_in,(pthread_attr_t *)&attr,thread_input,&data);
              if (iVar6 == 0) {
                iVar6 = pthread_create(&thd_out,(pthread_attr_t *)&attr,thread_output,&data);
                if (iVar6 != 0) {
                  pcVar8 = "failed to create thread for output ret %d\n";
                  goto LAB_001050bd;
                }
                if (cmd->frame_num < 0) {
                  _mpp_log_l(4,"mpi_dec_mt_test","*******************************************\n",0);
                  _mpp_log_l(4,"mpi_dec_mt_test","**** Press Enter to stop loop decoding ****\n",0);
                  _mpp_log_l(4,"mpi_dec_mt_test","*******************************************\n",0);
                  getc(_stdin);
                  data.loop_end = 1;
                }
              }
              else {
                pcVar8 = "failed to create thread for input ret %d\n";
LAB_001050bd:
                _mpp_log_l(2,"mpi_dec_mt_test",pcVar8,0,iVar6);
              }
              pthread_attr_destroy((pthread_attr_t *)&attr);
              pthread_join(thd_in,(void **)0x0);
              pthread_join(thd_out,(void **)0x0);
              MVar7 = (*mpi->reset)(ctx);
              MVar5 = MPP_OK;
              if (MVar7 != MPP_OK) {
                _mpp_log_l(2,"mpi_dec_mt_test","mpi->reset failed\n",0);
                MVar5 = MVar7;
              }
              goto LAB_00104e62;
            }
            pcVar8 = "%p failed to set split_parse ret %d\n";
          }
          else {
            pcVar8 = "%p failed to get decoder cfg ret %d\n";
          }
          _mpp_log_l(2,"mpi_dec_mt_test",pcVar8,0,ctx,MVar5);
          goto LAB_00104e62;
        }
        pcVar8 = "mpp_init failed\n";
      }
      else {
        pcVar8 = "mpp_create failed\n";
      }
    }
    else {
      pcVar8 = "mpp_packet_init failed\n";
    }
  }
  else {
    pcVar8 = "dec_buf_mgr_init failed\n";
  }
  _mpp_log_l(2,"mpi_dec_mt_test",pcVar8,0);
LAB_00104e62:
  if (packet != (MppPacket)0x0) {
    mpp_packet_deinit(&packet);
    packet = (MppPacket)0x0;
  }
  if (ctx != (MppCtx)0x0) {
    mpp_destroy();
    ctx = (MppCtx)0x0;
  }
  data.frm_grp = (MppBufferGroup)0x0;
  if (data.buf_mgr != (DecBufMgr)0x0) {
    dec_buf_mgr_deinit(data.buf_mgr);
    data.buf_mgr = (DecBufMgr)0x0;
  }
  if (data.fp_output != (FILE *)0x0) {
    fclose((FILE *)data.fp_output);
    data.fp_output = (FILE *)0x0;
  }
  if (local_f8 != (MppParam)0x0) {
    mpp_dec_cfg_deinit();
  }
  return MVar5;
}

Assistant:

int mt_dec_decode(MpiDecTestCmd *cmd)
{
    MPP_RET ret         = MPP_OK;
    FileReader reader   = cmd->reader;

    // base flow context
    MppCtx ctx          = NULL;
    MppApi *mpi         = NULL;

    // input / output
    MppPacket packet    = NULL;
    MppFrame  frame     = NULL;

    // config for runtime mode
    MppDecCfg cfg       = NULL;
    RK_U32 need_split   = 1;

    // paramter for resource malloc
    RK_U32 width        = cmd->width;
    RK_U32 height       = cmd->height;
    MppCodingType type  = cmd->type;

    pthread_t thd_in;
    pthread_t thd_out = 0;
    pthread_attr_t attr;
    MpiDecMtLoopData data;

    mpp_log("mpi_dec_mt_test start\n");
    memset(&data, 0, sizeof(data));

    if (cmd->have_output) {
        data.fp_output = fopen(cmd->file_output, "w+b");
        if (NULL == data.fp_output) {
            mpp_err("failed to open output file %s\n", cmd->file_output);
            goto MPP_TEST_OUT;
        }
    }

    ret = dec_buf_mgr_init(&data.buf_mgr);
    if (ret) {
        mpp_err("dec_buf_mgr_init failed\n");
        goto MPP_TEST_OUT;
    }

    ret = mpp_packet_init(&packet, NULL, 0);
    if (ret) {
        mpp_err("mpp_packet_init failed\n");
        goto MPP_TEST_OUT;
    }

    mpp_log("mpi_dec_mt_test decoder test start w %d h %d type %d\n", width, height, type);

    // decoder demo
    ret = mpp_create(&ctx, &mpi);
    if (ret) {
        mpp_err("mpp_create failed\n");
        goto MPP_TEST_OUT;
    }

    ret = mpp_init(ctx, MPP_CTX_DEC, type);
    if (ret) {
        mpp_err("mpp_init failed\n");
        goto MPP_TEST_OUT;
    }

    // NOTE: timeout value please refer to MppPollType definition
    //  0   - non-block call (default)
    // -1   - block call
    // +val - timeout value in ms
    {
        MppPollType timeout = MPP_POLL_BLOCK;
        MppParam param = &timeout;

        ret = mpi->control(ctx, MPP_SET_OUTPUT_TIMEOUT, param);
        if (ret) {
            mpp_err("Failed to set output timeout %d ret %d\n", timeout, ret);
            goto MPP_TEST_OUT;
        }
    }

    mpp_dec_cfg_init(&cfg);

    /* get default config from decoder context */
    ret = mpi->control(ctx, MPP_DEC_GET_CFG, cfg);
    if (ret) {
        mpp_err("%p failed to get decoder cfg ret %d\n", ctx, ret);
        goto MPP_TEST_OUT;
    }

    /*
     * split_parse is to enable mpp internal frame spliter when the input
     * packet is not aplited into frames.
     */
    ret = mpp_dec_cfg_set_u32(cfg, "base:split_parse", need_split);
    if (ret) {
        mpp_err("%p failed to set split_parse ret %d\n", ctx, ret);
        goto MPP_TEST_OUT;
    }

    ret = mpi->control(ctx, MPP_DEC_SET_CFG, cfg);
    if (ret) {
        mpp_err("%p failed to set cfg %p ret %d\n", ctx, cfg, ret);
        goto MPP_TEST_OUT;
    }

    data.cmd            = cmd;
    data.ctx            = ctx;
    data.mpi            = mpi;
    data.loop_end       = 0;
    data.packet         = packet;
    data.frame          = frame;
    data.frame_count    = 0;
    data.frame_num      = cmd->frame_num;
    data.reader         = reader;
    data.quiet          = cmd->quiet;

    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

    ret = pthread_create(&thd_in, &attr, thread_input, &data);
    if (ret) {
        mpp_err("failed to create thread for input ret %d\n", ret);
        goto THREAD_END;
    }

    ret = pthread_create(&thd_out, &attr, thread_output, &data);
    if (ret) {
        mpp_err("failed to create thread for output ret %d\n", ret);
        goto THREAD_END;
    }

    if (cmd->frame_num < 0) {
        // wait for input then quit decoding
        mpp_log("*******************************************\n");
        mpp_log("**** Press Enter to stop loop decoding ****\n");
        mpp_log("*******************************************\n");

        getc(stdin);
        data.loop_end = 1;
    }

THREAD_END:
    pthread_attr_destroy(&attr);

    pthread_join(thd_in, NULL);
    pthread_join(thd_out, NULL);

    ret = mpi->reset(ctx);
    if (ret) {
        mpp_err("mpi->reset failed\n");
        goto MPP_TEST_OUT;
    }

MPP_TEST_OUT:
    if (packet) {
        mpp_packet_deinit(&packet);
        packet = NULL;
    }

    if (frame) {
        mpp_frame_deinit(&frame);
        frame = NULL;
    }

    if (ctx) {
        mpp_destroy(ctx);
        ctx = NULL;
    }

    data.frm_grp = NULL;
    if (data.buf_mgr) {
        dec_buf_mgr_deinit(data.buf_mgr);
        data.buf_mgr = NULL;
    }

    if (data.fp_output) {
        fclose(data.fp_output);
        data.fp_output = NULL;
    }

    if (cfg) {
        mpp_dec_cfg_deinit(cfg);
        cfg = NULL;
    }

    return ret;
}